

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

void __thiscall
andres::View<int,true,std::allocator<unsigned_long>>::View<unsigned_long*>
          (View<int,true,std::allocator<unsigned_long>> *this,unsigned_long *begin,
          unsigned_long *end,pointer data,CoordinateOrder *externalCoordinateOrder,
          CoordinateOrder *internalCoordinateOrder,allocator_type *allocator)

{
  allocator_type local_11;
  
  *(pointer *)this = data;
  marray_detail::Geometry<std::allocator<unsigned_long>>::Geometry<unsigned_long*>
            ((Geometry<std::allocator<unsigned_long>> *)(this + 8),begin,end,externalCoordinateOrder
             ,internalCoordinateOrder,&local_11);
  View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)this);
  return;
}

Assistant:

inline
View<T, isConst, A>::View
(
    ShapeIterator begin,
    ShapeIterator end,
    pointer data,
    const CoordinateOrder& externalCoordinateOrder,
    const CoordinateOrder& internalCoordinateOrder,
    const allocator_type& allocator
) 
:   data_(data),
    geometry_(begin, end, externalCoordinateOrder, 
        internalCoordinateOrder, allocator)
{
    testInvariant();
}